

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_ghost_glob(REF_NODE ref_node,REF_GLOB *vector,REF_INT ldim)

{
  int iVar1;
  int iVar2;
  REF_MPI ref_mpi;
  REF_GLOB *pRVar3;
  bool bVar4;
  uint uVar5;
  REF_STATUS RVar6;
  uint uVar7;
  uint uVar8;
  REF_INT *pRVar9;
  long lVar10;
  long lVar11;
  void *pvVar12;
  int *piVar13;
  undefined8 uVar14;
  ulong uVar15;
  int iVar16;
  char *pcVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  REF_INT local;
  int local_8c;
  size_t local_88;
  void *local_80;
  REF_INT *local_78;
  ulong local_70;
  void *local_68;
  void *local_60;
  void *local_58;
  REF_GLOB *local_50;
  ulong local_48;
  ulong local_40;
  int *local_38;
  
  ref_mpi = ref_node->ref_mpi;
  if ((long)ref_mpi->n < 2) {
    return 0;
  }
  pRVar9 = (REF_INT *)malloc((long)ref_mpi->n << 2);
  if (pRVar9 == (REF_INT *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x3fe,
           "ref_node_ghost_glob","malloc a_size of REF_INT NULL");
    local_78 = (REF_INT *)0x0;
  }
  else {
    local_78 = pRVar9;
    if (0 < ref_mpi->n) {
      lVar10 = 0;
      do {
        pRVar9[lVar10] = 0;
        lVar10 = lVar10 + 1;
      } while (lVar10 < ref_mpi->n);
    }
  }
  if (pRVar9 == (REF_INT *)0x0) {
    return 2;
  }
  if ((long)ref_mpi->n < 0) {
    uVar8 = 1;
    pcVar17 = "malloc b_size of REF_INT negative";
LAB_00178762:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x3ff,
           "ref_node_ghost_glob",pcVar17);
    pRVar9 = (REF_INT *)0x0;
    bVar4 = false;
  }
  else {
    pRVar9 = (REF_INT *)malloc((long)ref_mpi->n << 2);
    if (pRVar9 == (REF_INT *)0x0) {
      uVar8 = 2;
      pcVar17 = "malloc b_size of REF_INT NULL";
      goto LAB_00178762;
    }
    uVar8 = 2;
    bVar4 = true;
    if (0 < ref_mpi->n) {
      lVar10 = 0;
      do {
        pRVar9[lVar10] = 0;
        lVar10 = lVar10 + 1;
        bVar4 = true;
      } while (lVar10 < ref_mpi->n);
    }
  }
  if (!bVar4) {
    return uVar8;
  }
  iVar16 = ref_node->max;
  if (0 < (long)iVar16) {
    pRVar3 = ref_node->global;
    lVar10 = 0;
    do {
      if ((-1 < pRVar3[lVar10]) && (ref_node->ref_mpi->id != ref_node->part[lVar10])) {
        local_78[ref_node->part[lVar10]] = local_78[ref_node->part[lVar10]] + 1;
      }
      lVar10 = lVar10 + 1;
    } while (iVar16 != lVar10);
  }
  uVar5 = ref_mpi_alltoall(ref_mpi,local_78,pRVar9,1);
  if (uVar5 != 0) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x408,
           "ref_node_ghost_glob",(ulong)uVar5);
    return uVar5;
  }
  iVar16 = ref_mpi->n;
  lVar10 = (long)iVar16;
  if (lVar10 < 1) {
    uVar5 = 0;
  }
  else {
    lVar11 = 0;
    uVar5 = 0;
    do {
      uVar5 = uVar5 + local_78[lVar11];
      lVar11 = lVar11 + 1;
    } while (lVar10 != lVar11);
  }
  local_50 = vector;
  if ((int)uVar5 < 0) {
    pcVar17 = "malloc a_global of REF_GLOB negative";
    uVar14 = 0x40c;
LAB_00178a5a:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar14,
           "ref_node_ghost_glob",pcVar17);
    RVar6 = 1;
  }
  else {
    local_88 = (ulong)uVar5 << 3;
    pvVar12 = malloc(local_88);
    if (pvVar12 == (void *)0x0) {
      pcVar17 = "malloc a_global of REF_GLOB NULL";
      uVar14 = 0x40c;
    }
    else {
      if (iVar16 < 1) {
        uVar19 = 0;
      }
      else {
        lVar11 = 0;
        uVar19 = 0;
        do {
          uVar19 = (ulong)(uint)((int)uVar19 + pRVar9[lVar11]);
          lVar11 = lVar11 + 1;
        } while (lVar10 != lVar11);
      }
      iVar18 = (int)uVar19;
      if (iVar18 < 0) {
        pcVar17 = "malloc b_global of REF_GLOB negative";
        uVar14 = 0x410;
        goto LAB_00178a5a;
      }
      local_80 = (void *)(uVar19 << 3);
      local_58 = pvVar12;
      pvVar12 = malloc((size_t)local_80);
      if (pvVar12 == (void *)0x0) {
        pcVar17 = "malloc b_global of REF_GLOB NULL";
        uVar14 = 0x410;
      }
      else {
        if (iVar16 < 0) {
          pcVar17 = "malloc a_next of REF_INT negative";
          uVar14 = 0x412;
          goto LAB_00178a5a;
        }
        local_60 = pvVar12;
        piVar13 = (int *)malloc(lVar10 * 4);
        if (piVar13 == (int *)0x0) {
          pcVar17 = "malloc a_next of REF_INT NULL";
          uVar14 = 0x412;
        }
        else {
          *piVar13 = 0;
          if (1 < iVar16) {
            iVar16 = *piVar13;
            lVar11 = 0;
            do {
              iVar16 = iVar16 + local_78[lVar11];
              piVar13[lVar11 + 1] = iVar16;
              lVar11 = lVar11 + 1;
            } while (lVar10 + -1 != lVar11);
          }
          iVar16 = ref_node->max;
          if (0 < (long)iVar16) {
            pRVar3 = ref_node->global;
            lVar10 = 0;
            do {
              if ((-1 < pRVar3[lVar10]) &&
                 (iVar1 = ref_node->part[lVar10], ref_node->ref_mpi->id != iVar1)) {
                iVar2 = piVar13[iVar1];
                *(REF_GLOB *)((long)local_58 + (long)iVar2 * 8) = pRVar3[lVar10];
                piVar13[iVar1] = iVar2 + 1;
              }
              lVar10 = lVar10 + 1;
            } while (iVar16 != lVar10);
          }
          local_38 = piVar13;
          uVar7 = ref_mpi_alltoallv(ref_mpi,local_58,local_78,local_60,pRVar9,1,2);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x422,"ref_node_ghost_glob",(ulong)uVar7,"alltoallv global");
            return uVar7;
          }
          iVar16 = (int)(0x7fffffff / (long)ldim);
          if (((int)uVar5 < iVar16) && (iVar18 < iVar16)) {
            if ((int)(uVar5 * ldim) < 0) {
              pcVar17 = "malloc a_vector of REF_GLOB negative";
              uVar14 = 0x425;
              goto LAB_00178a5a;
            }
            local_68 = malloc((ulong)(uVar5 * ldim) << 3);
            if (local_68 == (void *)0x0) {
              pcVar17 = "malloc a_vector of REF_GLOB NULL";
              uVar14 = 0x425;
            }
            else {
              if (iVar18 * ldim < 0) {
                pcVar17 = "malloc b_vector of REF_GLOB negative";
                uVar14 = 0x426;
                goto LAB_00178a5a;
              }
              local_80 = malloc((ulong)(uint)(iVar18 * ldim) << 3);
              if (local_80 != (void *)0x0) {
                if (iVar18 != 0) {
                  local_40 = (ulong)(uint)ldim << 3;
                  local_70 = 1;
                  if (1 < iVar18) {
                    local_70 = uVar19;
                  }
                  local_48 = (ulong)ldim;
                  local_88 = local_88 & 0xffffffff00000000;
                  uVar19 = 0;
                  do {
                    uVar8 = ref_node_local(ref_node,*(REF_GLOB *)((long)local_60 + uVar19 * 8),
                                           &local_8c);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                             ,0x428,"ref_node_ghost_glob",(ulong)uVar8,"g2l");
                      return uVar8;
                    }
                    iVar16 = (int)local_88;
                    if (0 < ldim) {
                      memcpy((void *)((long)local_80 + (local_88 & 0xffffffff) * 8),
                             local_50 + (long)local_8c * local_48,local_40);
                    }
                    uVar19 = uVar19 + 1;
                    local_88 = CONCAT44(local_88._4_4_,iVar16 + ldim);
                  } while (local_70 != uVar19);
                }
                uVar8 = ref_mpi_alltoallv(ref_mpi,local_80,pRVar9,local_68,local_78,ldim,2);
                if (uVar8 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                         ,0x42f,"ref_node_ghost_glob",(ulong)uVar8,"alltoallv vector");
                  return uVar8;
                }
                if (uVar5 != 0) {
                  local_88 = (ulong)(uint)ldim << 3;
                  uVar19 = 1;
                  if (1 < (int)uVar5) {
                    uVar19 = (ulong)uVar5;
                  }
                  local_70 = (ulong)ldim;
                  uVar20 = 0;
                  uVar15 = 0;
                  do {
                    uVar8 = ref_node_local(ref_node,*(REF_GLOB *)((long)local_58 + uVar15 * 8),
                                           &local_8c);
                    if (uVar8 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                             ,0x432,"ref_node_ghost_glob",(ulong)uVar8,"g2l");
                      return uVar8;
                    }
                    if (0 < ldim) {
                      memcpy(local_50 + (long)local_8c * local_70,
                             (void *)((long)local_68 + uVar20 * 8),local_88);
                    }
                    uVar15 = uVar15 + 1;
                    uVar20 = (ulong)(uint)((int)uVar20 + ldim);
                  } while (uVar19 != uVar15);
                }
                goto LAB_00178f45;
              }
              pcVar17 = "malloc b_vector of REF_GLOB NULL";
              uVar14 = 0x426;
              local_80 = (void *)0x0;
            }
          }
          else {
            local_68 = malloc(local_88);
            if (local_68 == (void *)0x0) {
              pcVar17 = "malloc a_vector of REF_GLOB NULL";
              uVar14 = 0x439;
            }
            else {
              local_80 = malloc((size_t)local_80);
              if (local_80 != (void *)0x0) {
                if (0 < ldim) {
                  local_40 = 1;
                  if (1 < iVar18) {
                    local_40 = uVar19;
                  }
                  local_48 = 1;
                  if (1 < (int)uVar5) {
                    local_48 = (ulong)uVar5;
                  }
                  local_88 = local_88 & 0xffffffff00000000;
                  do {
                    if (iVar18 != 0) {
                      uVar19 = 0;
                      do {
                        uVar7 = ref_node_local(ref_node,*(REF_GLOB *)((long)local_60 + uVar19 * 8),
                                               &local_8c);
                        if (uVar7 != 0) {
                          local_70 = CONCAT44(local_70._4_4_,uVar7);
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                 ,0x43d,"ref_node_ghost_glob",(ulong)uVar7,"g2l");
                          uVar7 = (uint)local_70;
                          uVar8 = (uint)local_70;
                        }
                        if (uVar7 != 0) {
                          return uVar8;
                        }
                        *(REF_GLOB *)((long)local_80 + uVar19 * 8) =
                             local_50[local_8c * ldim + (int)local_88];
                        uVar19 = uVar19 + 1;
                      } while (local_40 != uVar19);
                    }
                    uVar7 = ref_mpi_alltoallv(ref_mpi,local_80,pRVar9,local_68,local_78,1,2);
                    if (uVar7 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                             ,0x443,"ref_node_ghost_glob",(ulong)uVar7,"alltoallv vector");
                      return uVar7;
                    }
                    if (uVar5 != 0) {
                      uVar19 = 0;
                      do {
                        uVar7 = ref_node_local(ref_node,*(REF_GLOB *)((long)local_58 + uVar19 * 8),
                                               &local_8c);
                        if (uVar7 != 0) {
                          local_70 = CONCAT44(local_70._4_4_,uVar7);
                          printf("%s: %d: %s: %d %s\n",
                                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                                 ,0x446,"ref_node_ghost_glob",(ulong)uVar7,"g2l");
                          uVar7 = (uint)local_70;
                          uVar8 = (uint)local_70;
                        }
                        if (uVar7 != 0) {
                          return uVar8;
                        }
                        local_50[local_8c * ldim + (int)local_88] =
                             *(REF_GLOB *)((long)local_68 + uVar19 * 8);
                        uVar19 = uVar19 + 1;
                      } while (local_48 != uVar19);
                    }
                    iVar16 = (int)local_88 + 1;
                    local_88 = CONCAT44(local_88._4_4_,iVar16);
                  } while (iVar16 != ldim);
                }
LAB_00178f45:
                free(local_80);
                free(local_68);
                free(local_38);
                free(local_60);
                free(local_58);
                free(pRVar9);
                free(local_78);
                return 0;
              }
              pcVar17 = "malloc b_vector of REF_GLOB NULL";
              uVar14 = 0x43a;
              local_80 = (void *)0x0;
            }
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar14,
           "ref_node_ghost_glob",pcVar17);
    RVar6 = 2;
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_node_ghost_glob(REF_NODE ref_node, REF_GLOB *vector,
                                       REF_INT ldim) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT *a_size, *b_size;
  REF_INT a_total, b_total;
  REF_GLOB *a_global, *b_global;
  REF_INT part, node;
  REF_INT *a_next;
  REF_GLOB *a_vector, *b_vector;
  REF_INT i, local;

  if (!ref_mpi_para(ref_mpi)) return REF_SUCCESS;

  ref_malloc_init(a_size, ref_mpi_n(ref_mpi), REF_INT, 0);
  ref_malloc_init(b_size, ref_mpi_n(ref_mpi), REF_INT, 0);

  each_ref_node_valid_node(ref_node, node) {
    if (!ref_node_owned(ref_node, node)) {
      a_size[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoall(ref_mpi, a_size, b_size, REF_INT_TYPE),
      "alltoall sizes");

  a_total = 0;
  each_ref_mpi_part(ref_mpi, part) { a_total += a_size[part]; }
  ref_malloc(a_global, a_total, REF_GLOB);

  b_total = 0;
  each_ref_mpi_part(ref_mpi, part) { b_total += b_size[part]; }
  ref_malloc(b_global, b_total, REF_GLOB);

  ref_malloc(a_next, ref_mpi_n(ref_mpi), REF_INT);
  a_next[0] = 0;
  each_ref_mpi_worker(ref_mpi, part) {
    a_next[part] = a_next[part - 1] + a_size[part - 1];
  }

  each_ref_node_valid_node(ref_node, node) {
    if (!ref_node_owned(ref_node, node)) {
      part = ref_node_part(ref_node, node);
      a_global[a_next[part]] = ref_node_global(ref_node, node);
      a_next[ref_node_part(ref_node, node)]++;
    }
  }

  RSS(ref_mpi_alltoallv(ref_mpi, a_global, a_size, b_global, b_size, 1,
                        REF_GLOB_TYPE),
      "alltoallv global");

  if (a_total < REF_INT_MAX / ldim && b_total < REF_INT_MAX / ldim) {
    ref_malloc(a_vector, ldim * a_total, REF_GLOB);
    ref_malloc(b_vector, ldim * b_total, REF_GLOB);
    for (node = 0; node < b_total; node++) {
      RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
      for (i = 0; i < ldim; i++)
        b_vector[i + ldim * node] = vector[i + ldim * local];
    }

    RSS(ref_mpi_alltoallv(ref_mpi, b_vector, b_size, a_vector, a_size, ldim,
                          REF_GLOB_TYPE),
        "alltoallv vector");

    for (node = 0; node < a_total; node++) {
      RSS(ref_node_local(ref_node, a_global[node], &local), "g2l");
      for (i = 0; i < ldim; i++)
        vector[i + ldim * local] = a_vector[i + ldim * node];
    }
    free(b_vector);
    free(a_vector);
  } else {
    ref_malloc(a_vector, a_total, REF_GLOB);
    ref_malloc(b_vector, b_total, REF_GLOB);
    for (i = 0; i < ldim; i++) {
      for (node = 0; node < b_total; node++) {
        RSS(ref_node_local(ref_node, b_global[node], &local), "g2l");
        b_vector[node] = vector[i + ldim * local];
      }

      RSS(ref_mpi_alltoallv(ref_mpi, b_vector, b_size, a_vector, a_size, 1,
                            REF_GLOB_TYPE),
          "alltoallv vector");

      for (node = 0; node < a_total; node++) {
        RSS(ref_node_local(ref_node, a_global[node], &local), "g2l");
        vector[i + ldim * local] = a_vector[node];
      }
    }
    free(b_vector);
    free(a_vector);
  }

  free(a_next);
  free(b_global);
  free(a_global);
  free(b_size);
  free(a_size);

  return REF_SUCCESS;
}